

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O2

bool __thiscall
BamTools::Internal::BamReaderPrivate::CreateIndex(BamReaderPrivate *this,IndexType *type)

{
  bool bVar1;
  string message;
  string bracError;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  bVar1 = BgzfStream::IsOpen(&this->m_stream);
  if (bVar1) {
    bVar1 = BamRandomAccessController::CreateIndex(&this->m_randomAccessController,this,type);
    if (bVar1) {
      return true;
    }
    BamRandomAccessController::GetErrorString_abi_cxx11_(&local_38,&this->m_randomAccessController);
    std::__cxx11::string::string((string *)&local_78,"could not create index: \n\t",&local_79);
    std::operator+(&local_58,&local_78,&local_38);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::string((string *)&local_78,"BamReader::CreateIndex",&local_79);
    SetErrorString(this,&local_78,&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_38,"BamReader::CreateIndex",(allocator *)&local_78);
    std::__cxx11::string::string
              ((string *)&local_58,"cannot create index on unopened BAM file",&local_79);
    SetErrorString(this,&local_38,&local_58);
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return false;
}

Assistant:

bool BamReaderPrivate::CreateIndex(const BamIndex::IndexType& type)
{

    // skip if BAM file not open
    if (!IsOpen()) {
        SetErrorString("BamReader::CreateIndex", "cannot create index on unopened BAM file");
        return false;
    }

    // attempt to create index
    if (m_randomAccessController.CreateIndex(this, type))
        return true;
    else {
        const std::string bracError = m_randomAccessController.GetErrorString();
        const std::string message = std::string("could not create index: \n\t") + bracError;
        SetErrorString("BamReader::CreateIndex", message);
        return false;
    }
}